

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O1

string * __thiscall
MADPComponentDiscreteObservations::SoftPrintJointObservationSet_abi_cxx11_
          (string *__return_storage_ptr__,MADPComponentDiscreteObservations *this)

{
  pointer ppJVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  pointer ppJVar4;
  stringstream ss_1;
  stringstream ss;
  long *local_340;
  long local_338;
  long local_330 [47];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (this->_m_initialized != false) {
    ppJVar4 = (this->_m_jointObservationVec).
              super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppJVar1 = (this->_m_jointObservationVec).
              super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppJVar4 != ppJVar1) {
      do {
        (*((*ppJVar4)->super_JointObservation)._vptr_JointObservation[3])(&local_340);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(char *)local_340,local_338);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if (local_340 != local_330) {
          operator_delete(local_340,local_330[0] + 1);
        }
        ppJVar4 = ppJVar4 + 1;
      } while (ppJVar4 != ppJVar1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_330,"MADPComponentDiscreteObservations::PrintJointObservationSet(",
             0x3c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_330,") - Error: not initialized. ",0x1c);
  std::endl<char,std::char_traits<char>>((ostream *)local_330);
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar3 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar3,&E::typeinfo,E::~E);
}

Assistant:

string MADPComponentDiscreteObservations::SoftPrintJointObservationSet() const
{
    stringstream ss;
    if(!_m_initialized)
    {
    stringstream ss;
        ss << "MADPComponentDiscreteObservations::PrintJointObservationSet("<<
       ") - Error: not initialized. "<<endl;
    throw E(ss);
    }
    vector<JointObservationDiscrete*>::const_iterator jo_it = 
    _m_jointObservationVec.begin();
    vector<JointObservationDiscrete*>::const_iterator jo_last = 
    _m_jointObservationVec.end();
    while(jo_it != jo_last)
    {
        ss << (*jo_it)->SoftPrint()<<endl;
        jo_it++;    
    }
    return(ss.str());
}